

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdAddTxPegoutOutput
              (void *handle,void *create_handle,char *asset,int64_t amount,
              int mainchain_network_type,int elements_network_type,
              char *mainchain_genesis_block_hash,char *online_pubkey,char *master_online_key,
              char *mainchain_output_descriptor,uint32_t bip32_counter,char *whitelist,
              char **mainchain_address)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  int64_t in_RCX;
  char *in_RDX;
  long in_RSI;
  char *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  string *in_stack_00000020;
  char *in_stack_00000030;
  undefined8 *in_stack_00000038;
  CfdException *except;
  exception *std_except;
  Address btc_derive_address;
  ConfidentialTransactionContext *tx;
  Privkey master_online_privkey;
  NetType elements_net_type;
  NetType mainchain_net_type;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  int result;
  Privkey *in_stack_fffffffffffff668;
  Privkey *in_stack_fffffffffffff670;
  Address *this;
  undefined4 in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff684;
  undefined8 in_stack_fffffffffffff688;
  CfdError error_code;
  undefined4 in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff694;
  bool *in_stack_fffffffffffff6c8;
  allocator *paVar4;
  undefined8 in_stack_fffffffffffff6d0;
  int network_type;
  string *in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff784;
  string local_7d8;
  allocator local_7b1;
  string local_7b0;
  ByteData local_790;
  allocator local_771;
  string local_770 [39];
  allocator local_749;
  string local_748;
  Pubkey local_728 [10];
  NetType in_stack_fffffffffffff9cc;
  Address *in_stack_fffffffffffff9d0;
  BlockHash *in_stack_fffffffffffff9d8;
  ConfidentialAssetId *in_stack_fffffffffffff9e0;
  Amount *in_stack_fffffffffffff9e8;
  ConfidentialTransactionContext *in_stack_fffffffffffff9f0;
  Pubkey *in_stack_fffffffffffffa00;
  Privkey *in_stack_fffffffffffffa08;
  string *in_stack_fffffffffffffa10;
  uint32_t in_stack_fffffffffffffa18;
  ByteData *in_stack_fffffffffffffa20;
  NetType in_stack_fffffffffffffa28;
  Address *in_stack_fffffffffffffa30;
  allocator local_591;
  string local_590;
  BlockHash local_570;
  allocator local_549;
  string local_548;
  ConfidentialAssetId local_528;
  Amount local_500;
  Address local_4f0;
  undefined8 local_378;
  allocator local_369;
  string local_368;
  Privkey local_348;
  allocator local_321;
  string local_320;
  Privkey local_300;
  allocator local_2d9;
  string local_2d8;
  undefined1 local_2b8 [40];
  string local_290 [32];
  NetType local_270;
  undefined1 local_26a;
  allocator local_269;
  string local_268 [32];
  NetType local_248;
  undefined1 local_242;
  allocator local_241;
  string local_240 [38];
  undefined1 local_21a;
  allocator local_219;
  string local_218 [37];
  byte local_1f3;
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0 [32];
  CfdSourceLocation local_1d0;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [32];
  CfdSourceLocation local_190;
  undefined1 local_172;
  allocator local_171;
  string local_170 [32];
  CfdSourceLocation local_150;
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  CfdSourceLocation local_110;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  long local_78;
  allocator local_69;
  string local_68 [52];
  undefined4 local_34;
  int64_t local_28;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff688 >> 0x20);
  network_type = (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20);
  local_34 = 0xffffffff;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"TransactionData",&local_69);
  cfd::capi::CheckBuffer
            ((void *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             in_stack_fffffffffffff778);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  if (local_20 == (char *)0x0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0xbc2;
    local_90.funcname = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>(&local_90,"asset is null.");
    local_b2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. asset is null.",&local_b1);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               error_code,(string *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    local_b2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000008 == (char *)0x0) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0xbc8;
    local_d0.funcname = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>(&local_d0,"mainchain_genesis_block_hash is null.");
    local_f2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f0,"Failed to parameter. mainchain_genesis_block_hash is null.",&local_f1);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               error_code,(string *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    local_f2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000010 == (char *)0x0) {
    local_110.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_110.filename = local_110.filename + 1;
    local_110.line = 0xbce;
    local_110.funcname = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>(&local_110,"online_pubkey is null.");
    local_132 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Failed to parameter. online_pubkey is null.",&local_131)
    ;
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               error_code,(string *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    local_132 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000018 == (char *)0x0) {
    pcVar3 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
    local_150.filename = pcVar3 + 1;
    local_150.line = 0xbd4;
    local_150.funcname = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>(&local_150,"master_online_key is null.");
    local_172 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_170,"Failed to parameter. master_online_key is null.",&local_171);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               error_code,(string *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    local_172 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000020 == (string *)0x0) {
    pcVar3 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
    local_190.filename = pcVar3 + 1;
    local_190.line = 0xbda;
    local_190.funcname = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>(&local_190,"mainchain_output_descriptor is null.");
    local_1b2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1b0,"Failed to parameter. mainchain_output_descriptor is null.",&local_1b1);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               error_code,(string *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    local_1b2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000030 == (char *)0x0) {
    pcVar3 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
    local_1d0.filename = pcVar3 + 1;
    local_1d0.line = 0xbe0;
    local_1d0.funcname = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>(&local_1d0,"whitelist is null.");
    local_1f2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"Failed to parameter. whitelist is null.",&local_1f1);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               error_code,(string *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    local_1f2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_1f3 = 0;
  cfd::capi::ConvertNetType(network_type,in_stack_fffffffffffff6c8);
  if (*(long *)(local_78 + 0x18) == 0) {
    local_21a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"Invalid handle state. tx is null",&local_219);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               error_code,(string *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    local_21a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_1f3 & 1) != 0) {
    local_242 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"Invalid handle state. tx is bitcoin.",&local_241);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               error_code,(string *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    local_242 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_248 = cfd::capi::ConvertNetType(network_type,in_stack_fffffffffffff6c8);
  if ((local_1f3 & 1) == 0) {
    local_26a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_269;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"Invalid mainchain network type.",paVar4);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               error_code,(string *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    local_26a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_270 = cfd::capi::ConvertNetType(network_type,in_stack_fffffffffffff6c8);
  if ((local_1f3 & 1) != 0) {
    local_2b8[0x26] = '\x01';
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,"Invalid network type.",(allocator *)(local_2b8 + 0x27));
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               error_code,(string *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    local_2b8[0x26] = '\0';
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Privkey::Privkey((Privkey *)local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,in_stack_00000018,&local_2d9);
  bVar1 = cfd::core::Privkey::HasWif(&local_2d8,(NetType *)0x0,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_320,in_stack_00000018,&local_321);
    cfd::core::Privkey::FromWif(&local_300,&local_320,kCustomChain,true);
    cfd::core::Privkey::operator=(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    cfd::core::Privkey::~Privkey((Privkey *)0x5c3aee);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,in_stack_00000018,&local_369);
    cfd::core::Privkey::Privkey(&local_348,&local_368,kMainnet,true);
    cfd::core::Privkey::operator=(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    cfd::core::Privkey::~Privkey((Privkey *)0x5c3c23);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
  }
  local_378 = *(undefined8 *)(local_78 + 0x18);
  cfd::core::Address::Address(&local_4f0);
  cfd::core::Amount::Amount(&local_500,local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_548,local_20,&local_549);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_528,&local_548);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_590,in_stack_00000008,&local_591);
  cfd::core::BlockHash::BlockHash(&local_570,&local_590);
  cfd::core::Address::Address((Address *)(local_728 + 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_748,in_stack_00000010,&local_749);
  cfd::core::Pubkey::Pubkey(local_728,&local_748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,(char *)in_stack_00000020,&local_771);
  paVar4 = &local_7b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7b0,in_stack_00000030,paVar4);
  cfd::core::ByteData::ByteData(&local_790,&local_7b0);
  this = (Address *)local_2b8;
  cfd::ConfidentialTransactionContext::AddPegoutTxOut
            (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
             in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
             in_stack_fffffffffffffa00,in_stack_fffffffffffffa08,in_stack_fffffffffffffa10,
             in_stack_fffffffffffffa18,in_stack_fffffffffffffa20,in_stack_fffffffffffffa28,
             in_stack_fffffffffffffa30);
  cfd::core::ByteData::~ByteData((ByteData *)0x5c3f1f);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x5c3f60);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  cfd::core::Address::~Address(this);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x5c3f94);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5c3fbb);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  if (in_stack_00000038 != (undefined8 *)0x0) {
    cfd::core::Address::GetAddress_abi_cxx11_(&local_7d8,&local_4f0);
    pcVar3 = cfd::capi::CreateString(in_stack_00000020);
    *in_stack_00000038 = pcVar3;
    std::__cxx11::string::~string((string *)&local_7d8);
  }
  local_4 = 0;
  cfd::core::Address::~Address(this);
  cfd::core::Privkey::~Privkey((Privkey *)0x5c4275);
  return local_4;
}

Assistant:

int CfdAddTxPegoutOutput(
    void* handle, void* create_handle, const char* asset, int64_t amount,
    int mainchain_network_type, int elements_network_type,
    const char* mainchain_genesis_block_hash, const char* online_pubkey,
    const char* master_online_key, const char* mainchain_output_descriptor,
    uint32_t bip32_counter, const char* whitelist, char** mainchain_address) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (asset == nullptr) {
      warn(CFD_LOG_SOURCE, "asset is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null.");
    }
    if (mainchain_genesis_block_hash == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_genesis_block_hash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_genesis_block_hash is null.");
    }
    if (online_pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "online_pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. online_pubkey is null.");
    }
    if (master_online_key == nullptr) {
      warn(CFD_LOG_SOURCE, "master_online_key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. master_online_key is null.");
    }
    if (mainchain_output_descriptor == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_output_descriptor is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_output_descriptor is null.");
    }
    if (whitelist == nullptr) {
      warn(CFD_LOG_SOURCE, "whitelist is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. whitelist is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    auto mainchain_net_type =
        ConvertNetType(mainchain_network_type, &is_bitcoin);
    if (!is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid mainchain network type.");
    }
    auto elements_net_type =
        ConvertNetType(elements_network_type, &is_bitcoin);
    if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid network type.");
    }
    Privkey master_online_privkey;
    if (Privkey::HasWif(master_online_key)) {
      master_online_privkey = Privkey::FromWif(master_online_key);
    } else {
      master_online_privkey = Privkey(master_online_key);
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    Address btc_derive_address;
    tx->AddPegoutTxOut(
        Amount(amount), ConfidentialAssetId(asset),
        BlockHash(mainchain_genesis_block_hash), Address(), mainchain_net_type,
        Pubkey(online_pubkey), master_online_privkey,
        mainchain_output_descriptor, bip32_counter, ByteData(whitelist),
        elements_net_type, &btc_derive_address);

    if (mainchain_address != nullptr) {
      *mainchain_address = CreateString(btc_derive_address.GetAddress());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}